

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateRootLogLikelihoodsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,int count,double *outSumLogLikelihoodByPartition,
          double *outSumLogLikelihood)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  
  iVar1 = -7;
  if ((count == 1) && ((this->kFlags & 0x180) == 0)) {
    (**(code **)((long)(this->super_BeagleImpl)._vptr_BeagleImpl +
                (ulong)((this->kThreadingEnabled ^ 1) << 4) + 0x240))();
    *outSumLogLikelihood = 0.0;
    if (0 < partitionCount) {
      dVar3 = 0.0;
      uVar2 = 0;
      do {
        dVar3 = dVar3 + outSumLogLikelihoodByPartition[uVar2];
        uVar2 = uVar2 + 1;
        *outSumLogLikelihood = dVar3;
      } while ((uint)partitionCount != uVar2);
      if (NAN(dVar3)) {
        return -8;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateRootLogLikelihoodsByPartition(
                                                                  const int* bufferIndices,
                                                                  const int* categoryWeightsIndices,
                                                                  const int* stateFrequenciesIndices,
                                                                  const int* cumulativeScaleIndices,
                                                                  const int* partitionIndices,
                                                                  int partitionCount,
                                                                  int count,
                                                                  double* outSumLogLikelihoodByPartition,
                                                                  double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    if (count == 1) {
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            if (kThreadingEnabled) {
                calcRootLogLikelihoodsByPartitionAsync(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
            } else {
                calcRootLogLikelihoodsByPartition(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
            }

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < partitionCount; i++) {
                *outSumLogLikelihood += outSumLogLikelihoodByPartition[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood)
                returnCode = BEAGLE_ERROR_FLOATING_POINT;
        }
    } else {
        returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    return returnCode;
}